

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack31_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar6 = *(undefined1 (*) [16])(in + 1);
  auVar5 = vpmovsxbd_avx(ZEXT416(0x2010004));
  uVar1 = *in;
  uVar3 = *(ulong *)(in + 5);
  *out = uVar1 & 0x7fffffff;
  uVar2 = in[7];
  auVar4 = vpermi2d_avx512vl(auVar5,auVar6,ZEXT416(uVar1));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar3;
  auVar5 = vpalignr_avx(auVar7,auVar6,0xc);
  auVar7 = vpsllvd_avx2(auVar7,_DAT_001a0030);
  auVar4 = vpshldvd_avx512_vbmi2(auVar6,auVar4,_DAT_0019de60);
  auVar6 = vpsrlvd_avx2(auVar5,_DAT_001aa190);
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar5 = vpandd_avx512vl(auVar4,auVar5);
  auVar4._8_4_ = 0x7fffffe0;
  auVar4._0_8_ = 0x7fffffc07fffffe0;
  auVar4._12_4_ = 0x7fffffc0;
  auVar6 = vpternlogq_avx512vl(auVar7,auVar6,auVar4,0xec);
  *(undefined1 (*) [16])(out + 1) = auVar5;
  *(long *)(out + 5) = auVar6._0_8_;
  out[7] = (uVar2 & 0xffffff) << 7 | (uint)(uVar3 >> 0x39);
  return in + 8;
}

Assistant:

const uint32_t *__fastunpack31_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 31);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 30)) << (31 - 30);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 29)) << (31 - 29);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 28)) << (31 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 27)) << (31 - 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 26)) << (31 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 25)) << (31 - 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 24)) << (31 - 24);
  out++;

  return in + 1;
}